

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O1

double * __thiscall
FlatMap<Point,_double,_PointCmp>::operator[](FlatMap<Point,_double,_PointCmp> *this,Point *key)

{
  double dVar1;
  pair<Point,_double> *ppVar2;
  const_iterator __position;
  difference_type __d;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  tuple<> local_9;
  tuple<const_Point_&> local_8;
  
  __position._M_current =
       (this->vec_).
       super__Vector_base<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->vec_).
           super__Vector_base<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar3 = (long)ppVar2 - (long)__position._M_current;
  if (0 < (long)uVar3) {
    uVar3 = (uVar3 >> 3) * -0x5555555555555555;
    do {
      uVar4 = uVar3 >> 1;
      uVar5 = uVar4;
      if (__position._M_current[uVar4].first.x <= key->x &&
          key->x != __position._M_current[uVar4].first.x) {
        uVar5 = ~uVar4 + uVar3;
        __position._M_current = __position._M_current + uVar4 + 1;
      }
      uVar3 = uVar5;
    } while (0 < (long)uVar5);
  }
  if ((__position._M_current == ppVar2) ||
     (dVar1 = ((__position._M_current)->first).x, key->x <= dVar1 && dVar1 != key->x)) {
    local_8.super__Tuple_impl<0UL,_const_Point_&>.super__Head_base<0UL,_const_Point_&,_false>.
    _M_head_impl = (_Tuple_impl<0UL,_const_Point_&>)(_Tuple_impl<0UL,_const_Point_&>)key;
    __position._M_current =
         (pair<Point,_double> *)
         std::vector<std::pair<Point,double>,std::allocator<std::pair<Point,double>>>::
         _M_emplace_aux<std::piecewise_construct_t_const&,std::tuple<Point_const&>,std::tuple<>>
                   ((vector<std::pair<Point,double>,std::allocator<std::pair<Point,double>>> *)this,
                    __position,(piecewise_construct_t *)&std::piecewise_construct,&local_8,&local_9)
    ;
  }
  return &(__position._M_current)->second;
}

Assistant:

T& operator[](const Key& key) {
        auto pos = std::lower_bound(vec_.begin(), vec_.end(), key, valueToKeyComp_);
        if (pos == vec_.end() || comp_(key, pos->first)) {
            return vec_.emplace(pos, std::piecewise_construct, std::forward_as_tuple(key), std::tuple<>())->second;
        } else {
            return pos->second;
        }
    }